

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_array.h
# Opt level: O1

S2ClippedShape * __thiscall S2ShapeIndexCell::find_clipped(S2ShapeIndexCell *this,int shape_id)

{
  uint uVar1;
  value_type *s;
  S2ClippedShape *pSVar2;
  ulong uVar3;
  
  if ((this->shapes_).super_compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>.
      is_inlined_ == false) {
    pSVar2 = (this->shapes_).
             super_compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>.field_7.
             pointer_;
  }
  else {
    pSVar2 = (S2ClippedShape *)
             &(this->shapes_).
              super_compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>.field_7;
  }
  uVar1 = *(uint *)&(this->shapes_).
                    super_compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>;
  if ((uVar1 & 0xffffff) != 0) {
    uVar3 = (ulong)((uVar1 & 0xffffff) << 4);
    do {
      if (pSVar2->shape_id_ == shape_id) {
        return pSVar2;
      }
      pSVar2 = pSVar2 + 1;
      uVar3 = uVar3 - 0x10;
    } while (uVar3 != 0);
  }
  return (S2ClippedShape *)0x0;
}

Assistant:

T* Array() { return IsInlined() ? InlinedSpace() : pointer_; }